

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

void archive_mstring_clean(archive_mstring *aes)

{
  archive_mstring *aes_local;
  
  archive_wstring_free(&aes->aes_wcs);
  archive_string_free(&aes->aes_mbs);
  archive_string_free(&aes->aes_utf8);
  archive_string_free(&aes->aes_mbs_in_locale);
  aes->aes_set = L'\0';
  return;
}

Assistant:

void
archive_mstring_clean(struct archive_mstring *aes)
{
	archive_wstring_free(&(aes->aes_wcs));
	archive_string_free(&(aes->aes_mbs));
	archive_string_free(&(aes->aes_utf8));
	archive_string_free(&(aes->aes_mbs_in_locale));
	aes->aes_set = 0;
}